

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::DataTypeApplyFromText(char *buf,ImGuiDataType data_type,void *p_data,char *format)

{
  char cVar1;
  ulong __n;
  undefined1 uVar2;
  undefined2 uVar3;
  int iVar4;
  size_t fmt_out_size;
  int *piVar5;
  char *fmt_out;
  int v32;
  ImGuiDataType local_6c;
  char *local_68;
  ImGuiDataTypeTempStorage data_backup;
  char format_sanitized [32];
  
  for (; (cVar1 = *buf, cVar1 == '\t' || (cVar1 == ' ')); buf = buf + 1) {
  }
  if (cVar1 == '\0') {
    return false;
  }
  __n = GDataTypeInfo[data_type].Size;
  local_6c = data_type;
  local_68 = format;
  __memcpy_chk(&data_backup,p_data,__n,8);
  if ((data_type & 0xfffffffeU) == 8) {
    fmt_out = GDataTypeInfo[data_type].ScanFmt;
  }
  else {
    fmt_out = format_sanitized;
    ImParseFormatSanitizeForScanning(local_68,fmt_out,fmt_out_size);
  }
  v32 = 0;
  piVar5 = &v32;
  if (3 < __n) {
    piVar5 = (int *)p_data;
  }
  iVar4 = __isoc99_sscanf(buf,fmt_out,piVar5);
  if (iVar4 < 1) {
    return false;
  }
  if (3 < __n) goto switchD_001eb72c_default;
  switch(local_6c) {
  case 0:
    iVar4 = 0x7f;
    if (v32 < 0x7f) {
      iVar4 = v32;
    }
    uVar2 = 0x80;
    if (-0x80 < iVar4) {
      uVar2 = (undefined1)iVar4;
    }
    break;
  case 1:
    iVar4 = 0xff;
    if (v32 < 0xff) {
      iVar4 = v32;
    }
    uVar2 = 0;
    if (0 < iVar4) {
      uVar2 = (undefined1)iVar4;
    }
    break;
  case 2:
    iVar4 = 0x7fff;
    if (v32 < 0x7fff) {
      iVar4 = v32;
    }
    uVar3 = 0x8000;
    if (-0x8000 < iVar4) {
      uVar3 = (undefined2)iVar4;
    }
    goto LAB_001eb779;
  case 3:
    iVar4 = 0xffff;
    if (v32 < 0xffff) {
      iVar4 = v32;
    }
    uVar3 = 0;
    if (0 < iVar4) {
      uVar3 = (undefined2)iVar4;
    }
LAB_001eb779:
    *(undefined2 *)p_data = uVar3;
  default:
    goto switchD_001eb72c_default;
  }
  *(undefined1 *)p_data = uVar2;
switchD_001eb72c_default:
  iVar4 = bcmp(&data_backup,p_data,__n);
  return iVar4 != 0;
}

Assistant:

bool ImGui::DataTypeApplyFromText(const char* buf, ImGuiDataType data_type, void* p_data, const char* format)
{
    while (ImCharIsBlankA(*buf))
        buf++;
    if (!buf[0])
        return false;

    // Copy the value in an opaque buffer so we can compare at the end of the function if it changed at all.
    const ImGuiDataTypeInfo* type_info = DataTypeGetInfo(data_type);
    ImGuiDataTypeTempStorage data_backup;
    memcpy(&data_backup, p_data, type_info->Size);

    // Sanitize format
    // For float/double we have to ignore format with precision (e.g. "%.2f") because sscanf doesn't take them in, so force them into %f and %lf
    char format_sanitized[32];
    if (data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double)
        format = type_info->ScanFmt;
    else
        format = ImParseFormatSanitizeForScanning(format, format_sanitized, IM_ARRAYSIZE(format_sanitized));

    // Small types need a 32-bit buffer to receive the result from scanf()
    int v32 = 0;
    if (sscanf(buf, format, type_info->Size >= 4 ? p_data : &v32) < 1)
        return false;
    if (type_info->Size < 4)
    {
        if (data_type == ImGuiDataType_S8)
            *(ImS8*)p_data = (ImS8)ImClamp(v32, (int)IM_S8_MIN, (int)IM_S8_MAX);
        else if (data_type == ImGuiDataType_U8)
            *(ImU8*)p_data = (ImU8)ImClamp(v32, (int)IM_U8_MIN, (int)IM_U8_MAX);
        else if (data_type == ImGuiDataType_S16)
            *(ImS16*)p_data = (ImS16)ImClamp(v32, (int)IM_S16_MIN, (int)IM_S16_MAX);
        else if (data_type == ImGuiDataType_U16)
            *(ImU16*)p_data = (ImU16)ImClamp(v32, (int)IM_U16_MIN, (int)IM_U16_MAX);
        else
            IM_ASSERT(0);
    }

    return memcmp(&data_backup, p_data, type_info->Size) != 0;
}